

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<unsigned_int,_false,_false>::grow_and_add
          (FastVector<unsigned_int,_false,_false> *this,uint newSize,uint *valPtr,uint elem)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *ptr;
  uint local_38;
  uint i;
  uint oldMax;
  uint *oldData;
  uint elem_local;
  uint *valPtr_local;
  uint newSize_local;
  FastVector<unsigned_int,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  for (local_38 = 0; local_38 < elem; local_38 = local_38 + 1) {
    uVar2 = valPtr[local_38];
    uVar3 = this->count;
    this->count = uVar3 + 1;
    this->data[uVar3] = uVar2;
  }
  if (ptr != (uint *)0x0) {
    NULLC::destruct<unsigned_int>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}